

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

string * __thiscall
ParserProbModelXML::GetVariableName_abi_cxx11_(ParserProbModelXML *this,xmlNodePtr node)

{
  long lVar1;
  ostream *this_00;
  ulong uVar2;
  char *pcVar3;
  undefined8 in_RDX;
  string *in_RDI;
  size_t pos;
  string name;
  allocator<char> *in_stack_ffffffffffffffa0;
  ulong uVar4;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_19;
  undefined8 local_18;
  
  local_18 = in_RDX;
  lVar1 = xmlHasProp(in_RDX,"name");
  if (lVar1 == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Warning: Attempted to extract the name of a nameless node");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    xmlGetProp(local_18,"name");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    uVar2 = std::__cxx11::string::find_last_not_of(&stack0xffffffffffffffb0,0xbdc1b0);
    uVar4 = uVar2;
    lVar1 = std::__cxx11::string::length();
    if (((uVar2 <= lVar1 - 1U) && (uVar4 != 0)) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&stack0xffffffffffffffb0),
       *pcVar3 == ']')) {
      std::__cxx11::string::erase((ulong)&stack0xffffffffffffffb0,uVar4 - 2);
    }
    StringTools::Trim(in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return in_RDI;
}

Assistant:

string ParserProbModelXML::GetVariableName(const xmlNodePtr node) const
{
    if(!xmlHasProp(node, (xmlChar*) "name")){
        cout << "Warning: Attempted to extract the name of a nameless node" << endl;
        return "";
    }
    string name = (char*) xmlGetProp(node, (xmlChar*) "name");
    size_t pos = name.find_last_not_of(" \t");
    //remove the [0]/[1] tag from the name if it exists (for older versions of OpenMarkov).
    if(pos <= name.length()-1 && pos > 0)
    {
        if(name[pos] == ']')
            name.erase(pos-2);
    }
    //remove remaining whitespace
    return StringTools::Trim(name);
}